

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar2;
  undefined8 uVar3;
  HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHVar4;
  _Base_ptr p_Var5;
  int iVar6;
  int iVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  long lVar10;
  undefined8 *puVar11;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar12;
  undefined8 *puVar13;
  pointer piVar14;
  iterator *set;
  internal iVar15;
  byte bVar16;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  value_type input [4];
  AssertionResult gtest_ar_;
  set<int,_std::less<int>,_std::allocator<int>_> set_input;
  TypeParam ht_source;
  undefined8 local_428 [10];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [40];
  iterator local_3a0;
  const_nonempty_iterator local_398;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_390;
  int local_388;
  int local_384;
  int local_380;
  int local_37c [3];
  iterator local_370;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_328;
  internal local_320 [8];
  undefined8 *local_318;
  iterator local_310;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_2c8;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2c0;
  undefined ***local_278;
  const_nonempty_iterator local_270;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_268;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_260;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_258;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_250;
  HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_248;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_240;
  iterator local_210;
  undefined ***local_1c8;
  iterator local_1c0;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_178;
  iterator local_170;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_128;
  iterator local_120;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_d8;
  undefined **local_d0;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_c8;
  
  bVar16 = 0;
  local_2c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_2c0.pos.row_begin._M_current = local_2c0.pos.row_begin._M_current & 0xffffffff00000000;
  local_370.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_370.pos.row_begin._M_current._0_4_ = 0;
  local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffff00000000;
  local_3d8._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c231b8;
  set = &local_1c0;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_c8,0,(Hasher *)&local_2c0,(Hasher *)&local_370,
                     (Negation<int> *)&local_310,(SetKey<int,_Negation<int>_> *)set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_3d8);
  local_d0 = &PTR__BaseHashtableInterface_00c23138;
  iVar6 = UniqueObjectHelper<int>(10);
  local_2c0.ht._0_4_ = iVar6;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_3d8,&local_c8,(const_reference)&local_2c0);
  local_2c0.ht._0_4_ = UniqueObjectHelper<int>(100);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_3d8,&local_c8,(const_reference)&local_2c0);
  local_2c0.ht._0_4_ = UniqueObjectHelper<int>(1000);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_3d8,&local_c8,(const_reference)&local_2c0);
  local_2c0.ht._0_4_ = UniqueObjectHelper<int>(10000);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_3d8,&local_c8,(const_reference)&local_2c0);
  local_2c0.ht._0_4_ = UniqueObjectHelper<int>(100000);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_3d8,&local_c8,(const_reference)&local_2c0);
  iVar6 = UniqueObjectHelper<int>(1000000);
  local_2c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_2c0.ht._4_4_,iVar6);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_3d8,&local_c8,(const_reference)&local_2c0);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin((iterator *)local_3d8,&local_c8);
  local_388 = *(int *)local_3c8._16_8_;
  local_390 = (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)&local_d0;
  local_384 = UniqueObjectHelper<int>(2);
  local_380 = UniqueObjectHelper<int>(4);
  local_37c[0] = UniqueObjectHelper<int>(8);
  local_240._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240._M_impl.super__Rb_tree_header._M_header;
  local_240._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar6 = UniqueObjectHelper<int>(0x10f447);
  local_3d8._0_4_ = iVar6;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_240,(int *)local_3d8);
  local_3d8._0_4_ = UniqueObjectHelper<int>(0x1b207);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_240,(int *)local_3d8);
  local_3d8._0_4_ = UniqueObjectHelper<int>(0x2b67);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_240,(int *)local_3d8);
  local_3d8._0_4_ = UniqueObjectHelper<int>(0x457);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_240,(int *)local_3d8);
  local_3d8._0_4_ = UniqueObjectHelper<int>(0x6f);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_240,(int *)local_3d8);
  local_3d8._0_4_ = UniqueObjectHelper<int>(0xb);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_240,(int *)local_3d8);
  local_248 = this;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin(&local_210,&local_c8);
  local_2c0.ht = local_210.ht;
  local_2c0.pos.row_begin._M_current = local_210.pos.row_begin._M_current;
  local_2c0.pos.row_end._M_current = local_210.pos.row_end._M_current;
  local_250 = local_210.pos.row_current._M_current;
  local_2c0.pos.row_current._M_current = local_210.pos.row_current._M_current;
  local_2c0.pos.col_current = local_210.pos.col_current;
  local_258 = local_210.end.row_begin._M_current;
  local_2c0.end.row_begin._M_current = local_210.end.row_begin._M_current;
  local_260 = local_210.end.row_end._M_current;
  local_2c0.end.row_end._M_current = local_210.end.row_end._M_current;
  local_268 = local_210.end.row_current._M_current;
  local_2c0.end.row_current._M_current = local_210.end.row_current._M_current;
  local_270 = local_210.end.col_current;
  local_2c0.end.col_current = local_210.end.col_current;
  lVar10 = 3;
  local_278 = &local_d0;
  local_1c8 = &local_d0;
  do {
    local_2c0.pos.col_current = local_2c0.pos.col_current + 1;
    cVar8._M_current = local_2c0.pos.row_current._M_current;
    if (local_2c0.pos.col_current ==
        (local_2c0.pos.row_current._M_current)->group +
        ((local_2c0.pos.row_current._M_current)->settings).num_buckets) {
      do {
        cVar8._M_current = local_2c0.pos.row_current._M_current + 1;
        if (cVar8._M_current == local_2c0.pos.row_end._M_current) break;
        local_2c0.pos.col_current = (cVar8._M_current)->group;
        psVar2 = local_2c0.pos.row_current._M_current + 1;
        local_2c0.pos.row_current._M_current = cVar8._M_current;
      } while ((psVar2->settings).num_buckets == 0);
    }
    local_2c0.pos.row_current._M_current = cVar8._M_current;
    google::
    sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted(&local_2c0);
    pHVar4 = local_248;
    lVar10 = lVar10 + -1;
    if (lVar10 == 0) {
      local_3d8._0_8_ = local_210.ht;
      local_3d8._8_8_ = local_210.pos.row_begin._M_current;
      local_3c8._0_8_ = local_210.pos.row_end._M_current;
      local_3c8._8_8_ = local_250;
      local_3c8._16_8_ = local_210.pos.col_current;
      local_3c8._24_8_ = local_258;
      local_3c8._32_8_ = local_260;
      local_3a0._M_current = local_268;
      local_398 = local_270;
      local_390 = (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)&local_d0;
      this_00 = &(local_248->
                 super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_;
      puVar11 = (undefined8 *)local_3d8;
      puVar13 = (undefined8 *)&stack0xfffffffffffffb88;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar13 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
      }
      psVar12 = &local_2c0;
      puVar11 = local_428;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar11 = psVar12->ht;
        psVar12 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)((long)psVar12 + ((ulong)bVar16 * -2 + 1) * 8);
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
      }
      google::
      sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
      ::
      insert<google::BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
                ((sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                  *)this_00);
      local_310.ht._0_4_ = 3;
      local_370.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(*(size_type *)
                          ((long)&(pHVar4->
                                  super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  ).
                                  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  .ht_.
                                  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  .ht_.table.settings + 0x18) -
                        (pHVar4->
                        super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ).
                        super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.
                        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_deleted);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_3d8,"3u","this->ht_.size()",(uint *)&local_310,
                 (unsigned_long *)&local_370);
      if (local_3d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_370);
        if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_3d8._8_8_ ==
            (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          piVar14 = (pointer)0xafc493;
        }
        else {
          piVar14 = *(pointer *)local_3d8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x3ac,(char *)piVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&local_370)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
        if (local_370.ht !=
            (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          (**(code **)(*(long *)&((local_370.ht)->settings).
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 super_Hasher + 8))();
        }
      }
      uVar3 = local_3d8._8_8_;
      if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_3d8._8_8_ !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((int **)*(pointer *)local_3d8._8_8_ !=
            &(((Settings *)(local_3d8._8_8_ + 8))->
             super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
          operator_delete(*(pointer *)local_3d8._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      google::
      sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::begin((iterator *)local_3d8,this_00);
      pHVar1 = &(pHVar4->
                super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_;
      iVar6 = *(int *)local_3c8._16_8_;
      local_390 = pHVar1;
      iVar7 = UniqueObjectHelper<int>(10);
      iVar15 = (internal)0x1;
      if (iVar6 != iVar7) {
        google::
        sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::begin(&local_370,this_00);
        iVar6 = *local_370.pos.col_current;
        local_328 = pHVar1;
        iVar7 = UniqueObjectHelper<int>(100);
        if (iVar6 != iVar7) {
          google::
          sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::begin(&local_310,this_00);
          iVar6 = *local_310.pos.col_current;
          local_2c8 = pHVar1;
          iVar7 = UniqueObjectHelper<int>(1000);
          if (iVar6 != iVar7) {
            google::
            sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::begin(&local_1c0,this_00);
            iVar6 = *local_1c0.pos.col_current;
            local_178 = pHVar1;
            iVar7 = UniqueObjectHelper<int>(10000);
            if (iVar6 != iVar7) {
              google::
              sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::begin(&local_120,this_00);
              iVar6 = *local_120.pos.col_current;
              local_d8 = pHVar1;
              iVar7 = UniqueObjectHelper<int>(100000);
              if (iVar6 != iVar7) {
                google::
                sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::begin(&local_170,this_00);
                iVar6 = *local_170.pos.col_current;
                local_128 = pHVar1;
                iVar7 = UniqueObjectHelper<int>(1000000);
                iVar15 = (internal)(iVar6 == iVar7);
              }
            }
          }
        }
      }
      local_318 = (undefined8 *)0x0;
      local_320[0] = iVar15;
      if (iVar15 == (internal)0x0) {
        testing::Message::Message((Message *)&local_370);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3d8,local_320,
                   (AssertionResult *)
                   "*this->ht_.begin() == this->UniqueObject(10) || *this->ht_.begin() == this->UniqueObject(100) || *this->ht_.begin() == this->UniqueObject(1000) || *this->ht_.begin() == this->UniqueObject(10000) || *this->ht_.begin() == this->UniqueObject(100000) || *this->ht_.begin() == this->UniqueObject(1000000)"
                   ,"false","true",(char *)set);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x3b2,(char *)local_3d8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&local_370)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
        if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_3d8._0_8_ !=
            (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_3c8) {
          operator_delete((void *)local_3d8._0_8_);
        }
        if (local_370.ht !=
            (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          (**(code **)(*(long *)&((local_370.ht)->settings).
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 super_Hasher + 8))();
        }
      }
      puVar11 = local_318;
      if (local_318 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_318 != local_318 + 2) {
          operator_delete((undefined8 *)*local_318);
        }
        operator_delete(puVar11);
      }
      p_Var5 = local_240._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar10 = -3;
      p_Var9 = local_240._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0);
      google::
      sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
      ::insert<std::_Rb_tree_const_iterator<int>>
                ((sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                  *)this_00,p_Var5,p_Var9);
      local_310.ht._0_4_ = 6;
      local_370.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(*(size_type *)
                          ((long)&(pHVar4->
                                  super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  ).
                                  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  .ht_.
                                  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  .ht_.table.settings + 0x18) -
                        (pHVar4->
                        super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ).
                        super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.
                        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_deleted);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_3d8,"6u","this->ht_.size()",(uint *)&local_310,
                 (unsigned_long *)&local_370);
      if (local_3d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_370);
        if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_3d8._8_8_ ==
            (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          piVar14 = (pointer)0xafc493;
        }
        else {
          piVar14 = *(pointer *)local_3d8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x3bb,(char *)piVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&local_370)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
        if (local_370.ht !=
            (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          (**(code **)(*(long *)&((local_370.ht)->settings).
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 super_Hasher + 8))();
        }
      }
      uVar3 = local_3d8._8_8_;
      if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_3d8._8_8_ !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((int **)*(pointer *)local_3d8._8_8_ !=
            &(((Settings *)(local_3d8._8_8_ + 8))->
             super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
          operator_delete(*(pointer *)local_3d8._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      google::
      sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
      ::insert<int_const*>
                ((sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                  *)this_00,&local_388,local_37c);
      local_310.ht._0_4_ = 8;
      local_370.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(*(size_type *)
                          ((long)&(pHVar4->
                                  super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  ).
                                  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  .ht_.
                                  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  .ht_.table.settings + 0x18) -
                        (pHVar4->
                        super_HashtableIntTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ).
                        super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.
                        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_deleted);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_3d8,"8u","this->ht_.size()",(uint *)&local_310,
                 (unsigned_long *)&local_370);
      if (local_3d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_370);
        if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_3d8._8_8_ ==
            (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          piVar14 = (pointer)0xafc493;
        }
        else {
          piVar14 = *(pointer *)local_3d8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x3c1,(char *)piVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&local_370)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
        if (local_370.ht !=
            (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          (**(code **)(*(long *)&((local_370.ht)->settings).
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 super_Hasher + 8))();
        }
      }
      uVar3 = local_3d8._8_8_;
      if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_3d8._8_8_ !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((int **)*(pointer *)local_3d8._8_8_ !=
            &(((Settings *)(local_3d8._8_8_ + 8))->
             super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
          operator_delete(*(pointer *)local_3d8._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_240);
      local_d0 = &PTR__BaseHashtableInterface_00c231b8;
      std::
      vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
      ::~vector(&local_c8.table.groups);
      return;
    }
  } while( true );
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}